

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

Expression * __thiscall
CFG::Branch::Render(Branch *this,RelooperBuilder *Builder,Block *Target,bool SetLabel)

{
  Block *this_00;
  LocalSet *item;
  Break *pBVar1;
  Block *Ret;
  bool SetLabel_local;
  Block *Target_local;
  RelooperBuilder *Builder_local;
  Branch *this_local;
  
  this_00 = ::wasm::Builder::makeBlock(&Builder->super_Builder,(Expression *)0x0);
  if (this->Code != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               this->Code);
  }
  if (SetLabel) {
    item = RelooperBuilder::makeSetLabel(Builder,Target->Id);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
  }
  if (this->Type == Break) {
    pBVar1 = RelooperBuilder::makeBlockBreak(Builder,Target->Id);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pBVar1);
  }
  else if (this->Type == Continue) {
    if (this->Ancestor == (Shape *)0x0) {
      __assert_fail("Ancestor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                    ,0x84,"wasm::Expression *CFG::Branch::Render(RelooperBuilder &, Block *, bool)")
      ;
    }
    pBVar1 = RelooperBuilder::makeShapeContinue(Builder,this->Ancestor->Id);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pBVar1);
  }
  ::wasm::Block::finalize(this_00);
  return (Expression *)this_00;
}

Assistant:

wasm::Expression*
Branch::Render(RelooperBuilder& Builder, Block* Target, bool SetLabel) {
  auto* Ret = Builder.makeBlock();
  if (Code) {
    Ret->list.push_back(Code);
  }
  if (SetLabel) {
    Ret->list.push_back(Builder.makeSetLabel(Target->Id));
  }
  if (Type == Break) {
    Ret->list.push_back(Builder.makeBlockBreak(Target->Id));
  } else if (Type == Continue) {
    assert(Ancestor);
    Ret->list.push_back(Builder.makeShapeContinue(Ancestor->Id));
  }
  Ret->finalize();
  return Ret;
}